

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Roda *pRVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FrameBuffer *pFVar5;
  Baling *pBVar6;
  Belakang *this;
  Pesawat *this_00;
  Boom *pBVar7;
  Parachute *this_01;
  Orang *pOVar8;
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  int local_110;
  int local_10c;
  int tahap;
  int tinggi;
  int kount;
  int buatputar;
  float mutar;
  int g;
  Roda *ban;
  Orang *orang;
  Parachute *parasut;
  Boom *boom2;
  Boom *boom;
  int local_b0;
  undefined4 local_ac;
  int j_2;
  int local_8c;
  undefined4 local_88;
  int j_1;
  int local_68;
  int local_64;
  int j;
  int selesai;
  int hitung;
  float alpa;
  TanahIjo *ijo;
  Belakang *bel;
  pthread_t inc_x_thread;
  Baling *p3;
  Baling *p2;
  int temp;
  int x;
  int waktutembak;
  FrameBuffer *local_18;
  SiJagur *meriam;
  
  meriam._4_4_ = 0;
  system("clear");
  pFVar5 = (FrameBuffer *)operator_new(0x50);
  SiJagur::SiJagur((SiJagur *)pFVar5);
  local_18 = pFVar5;
  Polygon::resizeCenter(0.25);
  targetx = 0x154;
  tembakanx = 0x154;
  boolrubah = 0;
  Polygon::move((int)local_18,0);
  temp = 0;
  p2._4_4_ = 0;
  p2._0_4_ = tembakanx;
  pBVar6 = (Baling *)operator_new(0x50);
  Baling::Baling(pBVar6);
  p3 = pBVar6;
  pBVar6 = (Baling *)operator_new(0x50);
  Baling::Baling(pBVar6);
  inc_x_thread = (pthread_t)pBVar6;
  iVar2 = pthread_create((pthread_t *)&bel,(pthread_attr_t *)0x0,inc_x,(void *)((long)&p2 + 4));
  if (iVar2 != 0) {
    fprintf(_stderr,"Error creating thread\n");
    return 1;
  }
  this = (Belakang *)operator_new(0x50);
  Belakang::Belakang(this);
  ijo = (TanahIjo *)this;
  pFVar5 = (FrameBuffer *)operator_new(0x50);
  TanahIjo::TanahIjo((TanahIjo *)pFVar5);
  _hitung = pFVar5;
  do {
    if (tertembak != 0) {
      pBVar7 = (Boom *)operator_new(0x50);
      Boom::Boom(pBVar7);
      boom2 = pBVar7;
      pBVar7 = (Boom *)operator_new(0x50);
      Boom::Boom(pBVar7);
      parasut = (Parachute *)pBVar7;
      this_01 = (Parachute *)operator_new(0x50);
      Parachute::Parachute(this_01);
      orang = (Orang *)this_01;
      pOVar8 = (Orang *)operator_new(0x50);
      Orang::Orang(pOVar8);
      ban = (Roda *)pOVar8;
      pFVar5 = (FrameBuffer *)operator_new(0x50);
      Roda::Roda((Roda *)pFVar5);
      _mutar = pFVar5;
      Polygon::resizeCenter(0.3);
      Polygon::move((int)boom2,0x96);
      Polygon::resizeCenter(0.1);
      Polygon::move((int)orang,-0x50);
      Polygon::resizeCenter(0.1);
      Polygon::move((int)_mutar,-100);
      Polygon::resizeCenter(0.2);
      Polygon::move((int)ban,-0x50);
      Polygon::resizeCenter(0.25);
      Polygon::move((int)parasut,0x96);
      Polygon::print((FrameBuffer *)ijo);
      Polygon::setColor((int)ijo,0,0xae,0xef);
      Polygon::print(_hitung);
      Polygon::setColor((int)_hitung,0x36,0xda,0x16);
      Polygon::print((FrameBuffer *)boom2);
      Polygon::setColor((int)boom2,0xbe,0x1a,0x1f);
      Polygon::print((FrameBuffer *)parasut);
      Polygon::setColor((int)parasut,0xeb,0xd7,0);
      FrameBuffer::print();
      usleep(1000000);
      buatputar = 10;
      kount = 0x428c0000;
      tinggi = 0;
      tahap = 1;
      local_10c = Polygon::MaxY();
      local_10c = 0x20d - local_10c;
      local_110 = 1;
      do {
        Polygon::print((FrameBuffer *)ijo);
        Polygon::setColor((int)ijo,0,0xae,0xef);
        Polygon::print(_hitung);
        Polygon::setColor((int)_hitung,0x36,0xda,0x16);
        Polygon::print((FrameBuffer *)orang);
        Polygon::setColor((int)orang,0xff,0xff,0xff);
        Polygon::print((FrameBuffer *)ban);
        Polygon::setColor((int)ban,0xdc,0x14,0x3c);
        iVar2 = Polygon::MaxY();
        if ((iVar2 < 0x23f) && (local_110 == 1)) {
          if (local_10c < 300) {
            Polygon::move((int)_mutar,-3);
          }
          else {
            Polygon::move((int)_mutar,0);
          }
          buatputar = buatputar + 10;
        }
        else if ((local_110 == 1) && (iVar2 = Polygon::MaxY(), 0x23e < iVar2)) {
          local_110 = local_110 + 1;
          local_10c = (int)((double)local_10c / 1.5);
          if (local_10c < 10) {
            local_110 = 0;
            FrameBuffer::clear();
            return 0;
          }
        }
        iVar2 = Polygon::MaxY();
        if ((0x23f - local_10c < iVar2) && (local_110 == 2)) {
          Polygon::move((int)_mutar,-3);
          buatputar = buatputar + -10;
        }
        else if ((local_110 == 2) && (iVar2 = Polygon::MaxY(), iVar2 <= 0x23f - local_10c)) {
          local_110 = local_110 + -1;
        }
        iVar2 = Polygon::MaxY();
        if (iVar2 < 0x24e) {
          Polygon::move((int)ban,0);
          Polygon::move((int)orang,0);
          pRVar1 = ban;
          if (tinggi == -5) {
            tahap = -1;
          }
          else if (tinggi == 5) {
            tahap = 1;
          }
          if (tahap == -1) {
            iVar2 = Polygon::MinX();
            iVar3 = Polygon::MaxX();
            iVar4 = Polygon::MinY();
            Point<double>::Point(&local_128,(double)((iVar2 + iVar3) / 2),(double)iVar4,0.0);
            Polygon::rotate(-4.0,(Point *)pRVar1,0.0,0.0);
            pOVar8 = orang;
            iVar2 = Polygon::MinX();
            iVar3 = Polygon::MaxX();
            iVar4 = Polygon::MinY();
            Point<double>::Point(&local_140,(double)((iVar2 + iVar3) / 2),(double)iVar4,0.0);
            Polygon::rotate(-4.0,(Point *)pOVar8,0.0,0.0);
            tinggi = tinggi + 1;
          }
          else if (tahap == 1) {
            iVar2 = Polygon::MinX();
            iVar3 = Polygon::MaxX();
            iVar4 = Polygon::MinY();
            Point<double>::Point(&local_158,(double)((iVar2 + iVar3) / 2),(double)iVar4,0.0);
            Polygon::rotate(4.0,(Point *)pRVar1,0.0,0.0);
            pOVar8 = orang;
            iVar2 = Polygon::MinX();
            iVar3 = Polygon::MaxX();
            iVar4 = Polygon::MinY();
            Point<double>::Point(&local_170,(double)((iVar2 + iVar3) / 2),(double)iVar4,0.0);
            Polygon::rotate(4.0,(Point *)pOVar8,0.0,0.0);
            tinggi = tinggi + -1;
          }
        }
        iVar2 = Polygon::MaxY();
        if ((iVar2 < 0x20d) && (0.0 < (float)kount)) {
          Polygon::move((int)inc_x_thread,0);
          Polygon::rotateCenter((double)(float)kount,0.0,0.0);
          Polygon::move((int)p3,0);
          Polygon::rotateCenter((double)(float)kount,0.0,0.0);
          kount = (int)((float)kount - 2.0);
        }
        Polygon::print(_mutar);
        Polygon::setColor((int)_mutar,0,0,0);
        Polygon::print((FrameBuffer *)p3);
        Polygon::setColor((int)p3,0,0,0);
        Polygon::print((FrameBuffer *)inc_x_thread);
        Polygon::setColor((int)inc_x_thread,0,0,0);
        FrameBuffer::print();
        usleep(50000);
      } while( true );
    }
    this_00 = (Pesawat *)operator_new(0x50);
    Pesawat::Pesawat(this_00);
    p = this_00;
    pBVar6 = (Baling *)operator_new(0x50);
    Baling::Baling(pBVar6);
    p3 = pBVar6;
    pBVar6 = (Baling *)operator_new(0x50);
    Baling::Baling(pBVar6);
    selesai = 0x3f800000;
    inc_x_thread = (pthread_t)pBVar6;
    Polygon::resizeCenter(0.25);
    Polygon::resizeCenter(0.05);
    Polygon::move((int)p,0x96);
    Polygon::move((int)p3,200);
    Polygon::resizeCenter(0.05);
    Polygon::move((int)inc_x_thread,100);
    j = 1;
    local_64 = 0;
    while (local_64 < 10) {
      if (boolrubah == 1) {
        Polygon::move((int)local_18,tembakanx - (int)p2);
        p2._0_4_ = tembakanx;
        boolrubah = 0;
      }
      Polygon::print((FrameBuffer *)ijo);
      Polygon::setColor((int)ijo,0,0xae,0xef);
      Polygon::print(_hitung);
      Polygon::setColor((int)_hitung,0x36,0xda,0x16);
      if (j == 3) {
        Polygon::resizeCenter(1.1);
        Polygon::resizeCenter(1.03);
        Polygon::move((int)p3,6);
        Polygon::resizeCenter(1.03);
        Polygon::move((int)inc_x_thread,-6);
        j = 1;
        local_64 = local_64 + 1;
      }
      Polygon::rotateCenter(10.0,0.0,0.0);
      Polygon::rotateCenter(10.0,0.0,0.0);
      Polygon::print((FrameBuffer *)p);
      Polygon::setColor((int)p,0xfc,0xde,0x8a);
      Polygon::print((FrameBuffer *)p3);
      Polygon::setColor((int)p3,0,0,0);
      Polygon::print((FrameBuffer *)inc_x_thread);
      Polygon::setColor((int)inc_x_thread,0,0,0);
      if (booltembak == 1) {
        for (local_68 = tembakanx + -0x13; local_68 < tembakanx + 0x13; local_68 = local_68 + 1) {
          iVar2 = local_68 + 0x22;
          iVar3 = (targetx + local_68) - tembakanx;
          Color::Color((Color *)&local_88,-0x42,'\x1a','\x1f','\0');
          line::line((line *)&j_1,iVar2,600,0,iVar3,0,0,local_88);
          line::print((FrameBuffer *)&j_1);
          line::~line((line *)&j_1);
        }
        for (local_8c = tembakanx + -10; local_8c < tembakanx + 10; local_8c = local_8c + 1) {
          iVar2 = local_8c + 0x22;
          iVar3 = (targetx + local_8c) - tembakanx;
          Color::Color((Color *)&local_ac,-0x15,-0x29,'\0','\0');
          line::line((line *)&j_2,iVar2,600,0,iVar3,0,0,local_ac);
          line::print((FrameBuffer *)&j_2);
          line::~line((line *)&j_2);
        }
        temp = temp + 1;
        Polygon::print(local_18);
        Polygon::setColor((int)local_18,0xc0,0xc0,0xc0);
        if (temp == 6) {
          booltembak = 0;
          temp = 0;
          if (tertembak == 1) break;
        }
      }
      else {
        for (local_b0 = tembakanx + -3; local_b0 < tembakanx + 3; local_b0 = local_b0 + 1) {
          iVar2 = (targetx + local_b0) - tembakanx;
          Color::Color((Color *)&boom,-0x53,'\x1a','\x1f','\0');
          line::line((line *)((long)&boom + 4),iVar2,0x46,0,iVar2,0x4d,0,boom._0_4_);
          line::print((FrameBuffer *)((long)&boom + 4));
          line::~line((line *)((long)&boom + 4));
        }
      }
      Polygon::print(local_18);
      Polygon::setColor((int)local_18,0xc0,0xc0,0xc0);
      usleep(50000);
      j = j + 1;
      selesai = (int)((float)selesai + 5.0);
      FrameBuffer::print();
    }
    FrameBuffer::print();
  } while( true );
}

Assistant:

int main() {
  system("clear");
  SiJagur* meriam = new SiJagur();
  meriam->resizeCenter(0.25);
  targetx = 340;
  tembakanx = 340;
  boolrubah=0;
  meriam->move(0,215);
  int waktutembak=0;
  int x=0;
  int temp = tembakanx;
  Baling* p2 = new Baling();
  Baling* p3 = new Baling();
  pthread_t inc_x_thread;
  if(pthread_create(&inc_x_thread, NULL, inc_x, &x)) {
      fprintf(stderr, "Error creating thread\n");
      return 1;
  }
  Belakang* bel = new Belakang();
  TanahIjo* ijo = new TanahIjo();
  while(tertembak==0){
    p = new Pesawat();
    p2 = new Baling();
    p3 = new Baling();
    float alpa = 1;
    p->resizeCenter(0.25);
    p2->resizeCenter(0.05);
    p->move(150,-200);
    p2->move(200,-215);
    p3->resizeCenter(0.05);
    p3->move(100,-215);
    int hitung = 1;
    int selesai=0;
    while(selesai<10){
      if(boolrubah==1){
        meriam->move(tembakanx-temp,0);
        temp=tembakanx;
        boolrubah=0;
      }
      bel->print(fb);bel->setColor(0,174,239,alpa);
      ijo->print(fb);ijo->setColor(54,218,22,alpa);
      if(hitung == 3){
        p->resizeCenter(1.1);
        p2->resizeCenter(1.03);
        //p2->resizeCenter(1.15);
        p2->move(6,1);    
        p3->resizeCenter(1.03);
        //p3->resizeCenter(1.15);
        p3->move(-6,1);
        hitung=1;
        selesai++;
      }
      p2->rotateCenter(10);
      p3->rotateCenter(10);
      p->print(fb);p->setColor(252,222,138,alpa);
      p2->print(fb);p2->setColor(0,0,0,alpa);
      p3->print(fb);p3->setColor(0,0,0,alpa);
      if(booltembak==1){
        for(int j=tembakanx-19;j<tembakanx+19;j++)
          line(j+34,600,0,targetx+j-tembakanx,0,0,Color(190,26,31)).print(fb); 
         for(int j=tembakanx-10;j<tembakanx+10;j++)
          line(j+34,600,0,targetx+j-tembakanx,0,0,Color(235,215,0)).print(fb); 
        waktutembak++;
        meriam->print(fb);meriam->setColor(192,192,192,alpa);
        if(waktutembak==6){
          booltembak=0;
          waktutembak=0;
          if(tertembak==1)
            break;
        }
      }
      else{
        for(int j=tembakanx-3;j<tembakanx+3;j++)
          line(targetx+j-tembakanx,70,0,targetx+j-tembakanx,77,0,Color(173,26,31)).print(fb); 
       }
      meriam->print(fb);meriam->setColor(192,192,192,alpa);
      usleep(50000);
      hitung++;
      alpa +=5;
      fb.print();
    }
    fb.print();
  }
  Boom* boom = new Boom();
  Boom* boom2 = new Boom();
  Parachute* parasut = new Parachute();
  Orang* orang = new Orang();
  Roda* ban = new Roda();
  boom->resizeCenter(0.3);
  boom->move(150,-140);
  parasut->resizeCenter(0.1);
  parasut->move(-80,-200);
  ban->resizeCenter(0.1);
  ban->move(-100,-200);
  orang->resizeCenter(0.2);
  orang->move(-80,-260);
  boom2->resizeCenter(0.25);
  boom2->move(150,-140);
  bel->print(fb);bel->setColor(0,174,239,0);
  ijo->print(fb);ijo->setColor(54,218,22,0);
  boom->print(fb);boom->setColor(190,26,31,0);
  boom2->print(fb);boom2->setColor(235,215,0,0);
  fb.print();
  usleep(1000000);
  int g=10;
  float mutar=70;
  int buatputar=0;
  int kount=1;
  
  int tinggi=525-ban->MaxY();
  int tahap=1;
  while(true){
    bel->print(fb);bel->setColor(0,174,239,0);
    ijo->print(fb);ijo->setColor(54,218,22,0);
    parasut->print(fb);parasut->setColor(255,255,255,0);
    orang->print(fb);orang->setColor(220,20,60,0);
    if(ban->MaxY()<575&&tahap==1){
      if(tinggi<300)
      ban->move(-3,g/10);
      else
      ban->move(0,g/10);
      g+=10;
    }
    else if(tahap==1&&ban->MaxY()>=575){
      tahap++;
      tinggi=tinggi/1.5;
      if(tinggi<10){
        tahap=0;
        break;
      }
    }
    if(ban->MaxY()>575-tinggi&&tahap==2){
      ban->move(-3,-g/10);
      g-=10;
    }
    else if(tahap==2&&ban->MaxY()<=575-tinggi){
      tahap--;
    }
    if(orang->MaxY()<590){
      orang->move(0,5);
      parasut->move(0,5);
      if(buatputar==-5){
        kount=-1;
      }
      else if(buatputar==5){
        kount=1;
      }
      if(kount==-1){
         orang->rotate(-4,Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
         parasut->rotate(-4, Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
         buatputar++;
      }
      else if(kount==1){
        orang->rotate(4,Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
        parasut->rotate(4,Point<double>((parasut->MinX()+parasut->MaxX())/2,parasut->MinY()));
        buatputar--;
      }
    }
    if(p3->MaxY()<525 && mutar>0){
      p3->move(0,g/10);
      p3->rotateCenter(mutar);
      p2->move(0,g/10);
      p2->rotateCenter(mutar);
      mutar-=2;
    }
    ban->print(fb);ban->setColor(0,0,0,0);
    p2->print(fb);p2->setColor(0,0,0,0);
    p3->print(fb);p3->setColor(0,0,0,0);
    fb.print();
    usleep(50000);
  }
  fb.clear();
  return 0;
}